

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O1

int tool_progress_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  undefined4 uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  size_t __n;
  double dVar10;
  timeval newer;
  char format [40];
  char line [401];
  long local_210;
  undefined1 local_1f8 [48];
  char local_1c8;
  undefined4 local_1c7;
  undefined1 auStack_1c3 [403];
  
  newer = tvnow();
  lVar1 = *(long *)((long)clientp + 0xb8);
  if (lVar1 < 0) {
    local_210 = dltotal + ultotal;
    if (ultotal == 0 && dltotal == 0) {
      local_210 = 0x7fffffffffffffff;
    }
  }
  else {
    local_210 = lVar1 + dltotal + ultotal;
    if (0x7fffffffffffffff - lVar1 < dltotal + ultotal) {
      local_210 = 0x7fffffffffffffff;
    }
  }
  if (lVar1 < 0) {
    lVar8 = ulnow + dlnow;
    if (ultotal == 0 && dltotal == 0) {
      lVar8 = 0x7fffffffffffffff;
    }
  }
  else {
    lVar8 = lVar1 + ulnow + dlnow;
    if (0x7fffffffffffffff - lVar1 < ulnow + dlnow) {
      lVar8 = 0x7fffffffffffffff;
    }
  }
  lVar1 = *(long *)((long)clientp + 0x10);
  if (*(int *)((long)clientp + 0x88) != 0) {
    if (local_210 == 0) {
      lVar4 = tvdiff(newer,*(timeval *)((long)clientp + 0x98));
      if (lVar4 < 100) {
        return 0;
      }
      uVar3 = get_terminal_columns();
      if ((int)uVar3 < 0x191) {
        if ((int)uVar3 < 0x15) {
          *(undefined4 *)((long)clientp + 0xa8) = 0x14;
        }
        else {
          *(uint *)((long)clientp + 0xa8) = uVar3;
        }
      }
      else {
        *(undefined4 *)((long)clientp + 0xa8) = 400;
      }
      lVar4 = *(long *)((long)clientp + 0x90);
      iVar7 = *(int *)((long)clientp + 0xa8);
      local_1c8 = '\r';
      memset(&local_1c7,0x20,(long)iVar7);
      (&local_1c8)[(long)iVar7 + 1] = '\0';
      iVar9 = *(int *)((long)clientp + 0xc4);
      *(undefined4 *)(auStack_1c3 + (long)iVar9 + 0xfffffffffffffffc) = 0x3d4f3d2d;
      auStack_1c3[iVar9] = 0x2d;
      uVar3 = *(uint *)((long)clientp + 0xc0);
      iVar9 = 0;
      iVar7 = (int)(1000000 / (long)(iVar7 + -2));
      (&local_1c8)[(long)(sinus[uVar3 % 200] / iVar7) + 1] = '#';
      (&local_1c8)[(long)(sinus[uVar3 + ((uVar3 + 5) / 200) * -200 + 5] / iVar7) + 1] = '#';
      (&local_1c8)[(long)(sinus[uVar3 + ((uVar3 + 10) / 200) * -200 + 10] / iVar7) + 1] = '#';
      (&local_1c8)[(long)(sinus[uVar3 + ((uVar3 + 0xf) / 200) * -200 + 0xf] / iVar7) + 1] = '#';
      fputs(&local_1c8,*(FILE **)((long)clientp + 0xb0));
      uVar3 = *(int *)((long)clientp + 0xc0) + 2;
      uVar2 = *(int *)((long)clientp + 0xc0) - 0xc6;
      if (uVar3 < 200) {
        uVar2 = uVar3;
      }
      *(uint *)((long)clientp + 0xc0) = uVar2;
      if (lVar8 != lVar4) {
        iVar9 = *(int *)((long)clientp + 200);
      }
      iVar9 = iVar9 + *(int *)((long)clientp + 0xc4);
      *(int *)((long)clientp + 0xc4) = iVar9;
      iVar7 = *(int *)((long)clientp + 0xa8) + -6;
      uVar6 = 0xffffffff;
      if (iVar9 < iVar7) {
        if (-1 < iVar9) goto LAB_0010bf68;
        iVar7 = 0;
        uVar6 = 1;
      }
      *(undefined4 *)((long)clientp + 200) = uVar6;
      *(int *)((long)clientp + 0xc4) = iVar7;
    }
    else {
      if (*(long *)((long)clientp + 0x90) == lVar8) {
        return 0;
      }
      lVar4 = tvdiff(newer,*(timeval *)((long)clientp + 0x98));
      if ((lVar4 < 100) && (lVar8 < local_210)) {
        return 0;
      }
    }
  }
LAB_0010bf68:
  *(int *)((long)clientp + 0x88) = *(int *)((long)clientp + 0x88) + 1;
  uVar3 = get_terminal_columns();
  if ((int)uVar3 < 0x191) {
    if ((int)uVar3 < 0x15) {
      *(undefined4 *)((long)clientp + 0xa8) = 0x14;
    }
    else {
      *(uint *)((long)clientp + 0xa8) = uVar3;
    }
  }
  else {
    *(undefined4 *)((long)clientp + 0xa8) = 400;
  }
  if ((0 < local_210) && (lVar8 != *(long *)((long)clientp + 0x90))) {
    if (local_210 < lVar8) {
      local_210 = lVar8;
    }
    iVar7 = *(int *)((long)clientp + 0xa8) + -7;
    dVar10 = (double)iVar7 * ((double)lVar8 / (double)local_210);
    uVar5 = (ulong)dVar10;
    __n = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
    if (399 < __n) {
      __n = 400;
    }
    memset(&local_1c8,0x23,__n);
    (&local_1c8)[__n] = '\0';
    curl_msnprintf(local_1f8,0x28,"\r%%-%ds %%5.1f%%%%",iVar7);
    curl_mfprintf(((double)lVar8 / (double)local_210) * 100.0,*(undefined8 *)((long)clientp + 0xb0),
                  local_1f8,&local_1c8);
  }
  fflush(*(FILE **)((long)clientp + 0xb0));
  *(long *)((long)clientp + 0x90) = lVar8;
  *(timeval *)((long)clientp + 0x98) = newer;
  if (*(char *)(lVar1 + 0x342) == '\x01') {
    *(undefined1 *)(lVar1 + 0x342) = 0;
    curl_easy_pause(*(undefined8 *)((long)clientp + 0x20),0);
  }
  return 0;
}

Assistant:

int tool_progress_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  struct timeval now = tvnow();
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;
  struct ProgressData *bar = &per->progressbar;
  curl_off_t total;
  curl_off_t point;

  /* Calculate expected transfer size. initial_size can be less than zero when
     indicating that we are expecting to get the filesize from the remote */
  if(bar->initial_size < 0) {
    if(dltotal || ultotal)
      total = dltotal + ultotal;
    else
      total = CURL_OFF_T_MAX;
  }
  else if((CURL_OFF_T_MAX - bar->initial_size) < (dltotal + ultotal))
    total = CURL_OFF_T_MAX;
  else
    total = dltotal + ultotal + bar->initial_size;

  /* Calculate the current progress. initial_size can be less than zero when
     indicating that we are expecting to get the filesize from the remote */
  if(bar->initial_size < 0) {
    if(dltotal || ultotal)
      point = dlnow + ulnow;
    else
      point = CURL_OFF_T_MAX;
  }
  else if((CURL_OFF_T_MAX - bar->initial_size) < (dlnow + ulnow))
    point = CURL_OFF_T_MAX;
  else
    point = dlnow + ulnow + bar->initial_size;

  if(bar->calls) {
    /* after first call... */
    if(total) {
      /* we know the total data to get... */
      if(bar->prev == point)
        /* progress did not change since last invoke */
        return 0;
      else if((tvdiff(now, bar->prevtime) < 100L) && point < total)
        /* limit progress-bar updating to 10 Hz except when we are at 100% */
        return 0;
    }
    else {
      /* total is unknown */
      if(tvdiff(now, bar->prevtime) < 100L)
        /* limit progress-bar updating to 10 Hz */
        return 0;
      update_width(bar);
      fly(bar, point != bar->prev);
    }
  }

  /* simply count invokes */
  bar->calls++;

  update_width(bar);
  if((total > 0) && (point != bar->prev)) {
    char line[MAX_BARLENGTH + 1];
    char format[40];
    double frac;
    double percent;
    int barwidth;
    size_t num;
    if(point > total)
      /* we have got more than the expected total! */
      total = point;

    frac = (double)point / (double)total;
    percent = frac * 100.0;
    barwidth = bar->width - 7;
    num = (size_t) (((double)barwidth) * frac);
    if(num > MAX_BARLENGTH)
      num = MAX_BARLENGTH;
    memset(line, '#', num);
    line[num] = '\0';
    msnprintf(format, sizeof(format), "\r%%-%ds %%5.1f%%%%", barwidth);
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
    fprintf(bar->out, format, line, percent);
#ifdef __clang__
#pragma clang diagnostic pop
#endif
  }
  fflush(bar->out);
  bar->prev = point;
  bar->prevtime = now;

  if(config->readbusy) {
    config->readbusy = FALSE;
    curl_easy_pause(per->curl, CURLPAUSE_CONT);
  }

  return 0;
}